

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  Option *pOVar1;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *pFVar2;
  ProcessContext *pPVar3;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr params_00;
  StringPtr params_01;
  Vector<kj::MainBuilder::Impl::Arg> *pVVar4;
  bool bVar5;
  uint uVar7;
  size_t sVar8;
  StringPtr *pSVar9;
  StringPtr *end;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar10;
  bool bVar6;
  pointer ppVar11;
  ulong uVar12;
  pointer ppVar13;
  NullableValue<kj::String> *pNVar14;
  String *pSVar15;
  ArrayPtr<const_char> *pAVar16;
  Impl *pIVar17;
  size_t sVar18;
  char (*pacVar19) [18];
  char (*pacVar20) [18];
  kj *this_00;
  Vector<kj::MainBuilder::Impl::Arg> *pVVar21;
  Vector<kj::MainBuilder::Impl::Arg> *params_1;
  ArrayDisposer *this_01;
  String *pSVar22;
  String *in_R9;
  ArrayPtr<const_char> AVar23;
  StringPtr SVar24;
  String *in_stack_ffffffffffffef18;
  String *in_stack_ffffffffffffef20;
  bool local_fa2;
  bool local_f91;
  ArrayPtr<const_char> local_c68;
  char *local_c58;
  size_t sStack_c50;
  String *local_c48;
  String *error_8;
  Maybe<kj::String> local_c20;
  undefined1 local_c00 [8];
  NullableValue<kj::String> _error601;
  Function<kj::MainBuilder::Validity_()> *f;
  Function<kj::MainBuilder::Validity_()> *_f600;
  ArrayPtr<const_char> local_bb8;
  char *local_ba8;
  size_t sStack_ba0;
  String local_b90;
  ArrayPtr<const_char> local_b78;
  char *local_b68;
  size_t sStack_b60;
  String *local_b50;
  String *error_7;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRStack_b40;
  Validity local_b30;
  Maybe<kj::String> local_b10;
  undefined1 local_af0 [8];
  NullableValue<kj::String> _error587;
  ArrayPtr<const_char> local_ab8;
  char *local_aa8;
  size_t sStack_aa0;
  String *local_a90;
  String *error_6;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRStack_a80;
  Validity local_a70;
  Maybe<kj::String> local_a50;
  undefined1 local_a30 [8];
  NullableValue<kj::String> _error576;
  ArrayPtr<const_char> local_9f8;
  char *local_9e8;
  size_t sStack_9e0;
  uint local_9cc;
  Arg *pAStack_9c8;
  uint i_1;
  Arg *argSpec_1;
  Arg *__end1_1;
  Arg *__begin1_1;
  Vector<kj::MainBuilder::Impl::Arg> *__range1_1;
  StringPtr *argPos;
  Arg *argSpec;
  Arg *__end1;
  Arg *__begin1;
  Vector<kj::MainBuilder::Impl::Arg> *__range1;
  undefined1 auStack_978 [4];
  uint requiredArgCount;
  char *local_968;
  size_t sStack_960;
  String local_950;
  ArrayPtr<const_char> local_938;
  char *local_928;
  size_t sStack_920;
  size_t local_918;
  size_t sStack_910;
  String local_900;
  ArrayPtr<const_char> local_8e8;
  char *local_8d8;
  size_t sStack_8d0;
  StringPtr local_8c0;
  StringPtr local_8b0;
  StringPtr local_8a0;
  StringPtr local_890;
  StringPtr local_880;
  StringPtr local_870;
  StringPtr local_860;
  uint local_850;
  uint local_84c;
  uint j_1;
  uint count;
  ArrayPtr<kj::StringPtr> local_838;
  ArrayPtr<const_kj::StringPtr> local_828;
  undefined1 local_811 [25];
  ArrayPtr<const_char> local_7f8;
  undefined1 local_7e8 [8];
  StringPtr dummyArg;
  MainFunc subMain_1;
  StringPtr local_7b8;
  undefined4 local_7a4;
  ArrayPtr<const_kj::StringPtr> local_7a0;
  undefined1 local_789 [25];
  ArrayPtr<const_char> local_770;
  undefined1 local_760 [8];
  MainFunc subMain;
  _Self local_748;
  iterator iter_2;
  ArrayPtr<const_char> local_728;
  char *local_718;
  size_t sStack_710;
  String *local_708;
  String *error_5;
  Maybe<kj::String> local_6e0;
  undefined1 local_6c0 [8];
  NullableValue<kj::String> _error488;
  ArrayPtr<const_char> local_688;
  char *local_678;
  size_t sStack_670;
  String local_660;
  ArrayPtr<const_char> local_648;
  char *local_638;
  size_t sStack_630;
  String *local_620;
  String *error_4;
  size_t sStack_610;
  Validity local_600;
  Maybe<kj::String> local_5e0;
  undefined1 local_5c0 [8];
  NullableValue<kj::String> _error479;
  String local_590;
  ArrayPtr<const_char> local_578;
  char *local_568;
  size_t sStack_560;
  String *local_550;
  String *error_3;
  size_t sStack_540;
  Validity local_538;
  Maybe<kj::String> local_518;
  undefined1 local_4f8 [8];
  NullableValue<kj::String> _error471;
  StringPtr arg_1;
  Option *option_1;
  ArrayPtr<const_char> local_4a8;
  char *local_498;
  size_t sStack_490;
  _Self local_488;
  _Self local_480;
  iterator iter_1;
  undefined1 local_470 [3];
  char c;
  uint j;
  String local_460;
  ArrayPtr<const_char> local_448;
  char *local_438;
  size_t sStack_430;
  String local_420;
  ArrayPtr<const_char> local_408;
  char *local_3f8;
  size_t sStack_3f0;
  String *local_3e0;
  String *error_2;
  Maybe<kj::String> local_3b8;
  undefined1 local_398 [8];
  NullableValue<kj::String> _error449;
  String local_370;
  ArrayPtr<const_char> local_358;
  char *local_348;
  size_t sStack_340;
  String local_330;
  ArrayPtr<const_char> local_318;
  char *local_308;
  size_t sStack_300;
  String *local_2f0;
  String *error_1;
  size_t sStack_2e0;
  Validity local_2d0;
  Maybe<kj::String> local_2b0;
  undefined1 local_290 [8];
  NullableValue<kj::String> _error440;
  String local_260;
  ArrayPtr<const_char> local_248;
  char *local_238;
  size_t sStack_230;
  String *local_220;
  String *error;
  size_t sStack_210;
  Validity local_208;
  Maybe<kj::String> local_1e8;
  undefined1 local_1c8 [8];
  NullableValue<kj::String> _error433;
  StringPtr *arg;
  StringPtr *_arg431;
  Option *option;
  ArrayPtr<const_char> local_178;
  char *local_168;
  size_t sStack_160;
  size_t local_158;
  size_t sStack_150;
  StringPtr local_148;
  _Self local_138;
  _Self local_130;
  iterator iter;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> local_f8;
  unsigned_long *local_e8;
  unsigned_long *pos;
  undefined1 local_d0 [8];
  NullableValue<unsigned_long> _pos414;
  Maybe<kj::StringPtr> maybeArg;
  ArrayPtr<const_char> name;
  StringPtr local_88;
  undefined1 auStack_78 [8];
  StringPtr param;
  size_t local_58;
  size_t i;
  Vector<kj::StringPtr> arguments;
  MainImpl *this_local;
  ArrayPtr<const_kj::StringPtr> params_local;
  StringPtr programName_local;
  
  pSVar22 = (String *)params.size_;
  this_local = (MainImpl *)params.ptr;
  sVar18 = programName.content.size_;
  params_local.size_ = (size_t)programName.content.ptr;
  arguments.builder.disposer = (ArrayDisposer *)this;
  params_local.ptr = (StringPtr *)pSVar22;
  Vector<kj::StringPtr>::Vector((Vector<kj::StringPtr> *)&i);
  local_58 = 0;
  do {
    sVar8 = ArrayPtr<const_kj::StringPtr>::size((ArrayPtr<const_kj::StringPtr> *)&this_local);
    if (sVar8 <= local_58) {
LAB_002b5ac6:
      pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
      bVar5 = std::
              map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
              ::empty(&pIVar17->subCommands);
      if (!bVar5) {
        local_968 = (char *)params_local.size_;
        sStack_960 = sVar18;
        StringPtr::StringPtr((StringPtr *)auStack_978,"missing command");
        SVar24.content.size_ = sStack_960;
        SVar24.content.ptr = local_968;
        usageError(this,SVar24,(StringPtr)_auStack_978);
      }
      __range1._4_4_ = 0;
      pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
      __begin1 = (Arg *)&pIVar17->args;
      __end1 = Vector<kj::MainBuilder::Impl::Arg>::begin
                         ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1);
      argSpec = Vector<kj::MainBuilder::Impl::Arg>::end
                          ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1);
      for (; __end1 != argSpec; __end1 = __end1 + 1) {
        argPos = &__end1->title;
        __range1._4_4_ = __end1->minCount + __range1._4_4_;
      }
      __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)
                   Vector<kj::StringPtr>::begin((Vector<kj::StringPtr> *)&i);
      pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
      __begin1_1 = (Arg *)&pIVar17->args;
      __end1_1 = Vector<kj::MainBuilder::Impl::Arg>::begin
                           ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1_1);
      argSpec_1 = Vector<kj::MainBuilder::Impl::Arg>::end
                            ((Vector<kj::MainBuilder::Impl::Arg> *)__begin1_1);
      for (; pVVar4 = __range1_1, __end1_1 != argSpec_1; __end1_1 = __end1_1 + 1) {
        pAStack_9c8 = __end1_1;
        for (local_9cc = 0; pVVar4 = __range1_1, local_9cc < pAStack_9c8->minCount;
            local_9cc = local_9cc + 1) {
          pVVar21 = (Vector<kj::MainBuilder::Impl::Arg> *)
                    Vector<kj::StringPtr>::end((Vector<kj::StringPtr> *)&i);
          if (pVVar4 == pVVar21) {
            local_9e8 = (char *)params_local.size_;
            sStack_9e0 = sVar18;
            str<char_const(&)[18],kj::StringPtr&>
                      ((String *)&_error576.field_1.value.content.disposer,(kj *)"missing argument "
                       ,(char (*) [18])pAStack_9c8,(StringPtr *)pVVar21);
            StringPtr::StringPtr
                      ((StringPtr *)&local_9f8,(String *)&_error576.field_1.value.content.disposer);
            programName_04.content.size_ = sStack_9e0;
            programName_04.content.ptr = local_9e8;
            usageError(this,programName_04,(StringPtr)local_9f8);
          }
          error_6 = (String *)(__range1_1->builder).ptr;
          pRStack_a80 = (__range1_1->builder).pos;
          params_00.content.ptr = (char *)(__range1_1->builder).ptr;
          params_00.content.size_ = (size_t)(__range1_1->builder).pos;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_a70,&pAStack_9c8->callback,params_00);
          Validity::releaseError(&local_a50,&local_a70);
          pNVar14 = kj::_::readMaybe<kj::String>(&local_a50);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_a30,pNVar14);
          Maybe<kj::String>::~Maybe(&local_a50);
          Validity::~Validity(&local_a70);
          pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_a30);
          if (pSVar15 != (String *)0x0) {
            local_a90 = kj::_::NullableValue<kj::String>::operator*
                                  ((NullableValue<kj::String> *)local_a30);
            local_aa8 = (char *)params_local.size_;
            sStack_aa0 = sVar18;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&_error587.field_1.value.content.disposer,(kj *)__range1_1,
                       (StringPtr *)0x2eef9c,(char (*) [3])local_a90,pSVar22);
            StringPtr::StringPtr
                      ((StringPtr *)&local_ab8,(String *)&_error587.field_1.value.content.disposer);
            programName_03.content.size_ = sStack_aa0;
            programName_03.content.ptr = local_aa8;
            usageError(this,programName_03,(StringPtr)local_ab8);
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_a30);
          __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)&(__range1_1->builder).endPtr;
          __range1._4_4_ = __range1._4_4_ - 1;
        }
        while( true ) {
          bVar5 = false;
          if (local_9cc < pAStack_9c8->maxCount) {
            pSVar9 = Vector<kj::StringPtr>::end((Vector<kj::StringPtr> *)&i);
            bVar5 = (long)(ulong)__range1._4_4_ < (long)pSVar9 - (long)__range1_1 >> 4;
          }
          if (!bVar5) break;
          error_7 = (String *)(__range1_1->builder).ptr;
          pRStack_b40 = (__range1_1->builder).pos;
          params_01.content.ptr = (char *)(__range1_1->builder).ptr;
          params_01.content.size_ = (size_t)(__range1_1->builder).pos;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_b30,&pAStack_9c8->callback,params_01);
          Validity::releaseError(&local_b10,&local_b30);
          pNVar14 = kj::_::readMaybe<kj::String>(&local_b10);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_af0,pNVar14);
          Maybe<kj::String>::~Maybe(&local_b10);
          Validity::~Validity(&local_b30);
          pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_af0);
          if (pSVar15 != (String *)0x0) {
            local_b50 = kj::_::NullableValue<kj::String>::operator*
                                  ((NullableValue<kj::String> *)local_af0);
            local_b68 = (char *)params_local.size_;
            sStack_b60 = sVar18;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      (&local_b90,(kj *)__range1_1,(StringPtr *)0x2eef9c,(char (*) [3])local_b50,
                       pSVar22);
            StringPtr::StringPtr((StringPtr *)&local_b78,&local_b90);
            programName_02.content.size_ = sStack_b60;
            programName_02.content.ptr = local_b68;
            usageError(this,programName_02,(StringPtr)local_b78);
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_af0);
          __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)&(__range1_1->builder).endPtr;
          local_9cc = local_9cc + 1;
        }
      }
      params_1 = (Vector<kj::MainBuilder::Impl::Arg> *)
                 Vector<kj::StringPtr>::end((Vector<kj::StringPtr> *)&i);
      pVVar21 = __range1_1;
      if (pVVar4 < params_1) {
        local_ba8 = (char *)params_local.size_;
        __range1_1 = (Vector<kj::MainBuilder::Impl::Arg> *)&(__range1_1->builder).endPtr;
        sStack_ba0 = sVar18;
        str<kj::StringPtr&,char_const(&)[21]>
                  ((String *)&_f600,(kj *)pVVar21,(StringPtr *)": too many arguments",
                   (char (*) [21])params_1);
        StringPtr::StringPtr((StringPtr *)&local_bb8,(String *)&_f600);
        programName_01.content.size_ = sStack_ba0;
        programName_01.content.ptr = local_ba8;
        usageError(this,programName_01,(StringPtr)local_bb8);
      }
      pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
      this_01 = (ArrayDisposer *)
                kj::_::readMaybe<kj::Function<kj::MainBuilder::Validity()>>(&pIVar17->finalCallback)
      ;
      if (this_01 != (ArrayDisposer *)0x0) {
        _error601.field_1.value.content.disposer = this_01;
        Function<kj::MainBuilder::Validity_()>::operator()
                  ((Validity *)&error_8,(Function<kj::MainBuilder::Validity_()> *)this_01);
        Validity::releaseError(&local_c20,(Validity *)&error_8);
        pNVar14 = kj::_::readMaybe<kj::String>(&local_c20);
        kj::_::NullableValue<kj::String>::NullableValue
                  ((NullableValue<kj::String> *)local_c00,pNVar14);
        Maybe<kj::String>::~Maybe(&local_c20);
        Validity::~Validity((Validity *)&error_8);
        pSVar22 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_c00);
        if (pSVar22 != (String *)0x0) {
          local_c48 = kj::_::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_c00);
          local_c58 = (char *)params_local.size_;
          sStack_c50 = sVar18;
          StringPtr::StringPtr((StringPtr *)&local_c68,local_c48);
          programName_00.content.size_ = sStack_c50;
          programName_00.content.ptr = local_c58;
          usageError(this,programName_00,(StringPtr)local_c68);
        }
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_c00);
      }
      local_7a4 = 0;
LAB_002b646e:
      Vector<kj::StringPtr>::~Vector((Vector<kj::StringPtr> *)&i);
      return;
    }
    pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                       ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58);
    auStack_78 = (undefined1  [8])(pSVar9->content).ptr;
    param.content.ptr = (char *)(pSVar9->content).size_;
    StringPtr::StringPtr(&local_88,"--");
    bVar5 = StringPtr::operator==((StringPtr *)auStack_78,&local_88);
    if (bVar5) {
      pSVar9 = ArrayPtr<const_kj::StringPtr>::begin((ArrayPtr<const_kj::StringPtr> *)&this_local);
      end = ArrayPtr<const_kj::StringPtr>::end((ArrayPtr<const_kj::StringPtr> *)&this_local);
      Vector<kj::StringPtr>::addAll<kj::StringPtr_const*>
                ((Vector<kj::StringPtr> *)&i,pSVar9 + local_58 + 1,end);
      goto LAB_002b5ac6;
    }
    StringPtr::StringPtr((StringPtr *)&name.size_,"--");
    bVar5 = StringPtr::startsWith((StringPtr *)auStack_78,(StringPtr *)&name.size_);
    if (bVar5) {
      ArrayPtr<const_char>::ArrayPtr
                ((ArrayPtr<const_char> *)&maybeArg.ptr.field_1.value.content.size_);
      Maybe<kj::StringPtr>::Maybe((Maybe<kj::StringPtr> *)&_pos414.field_1);
      StringPtr::findFirst((StringPtr *)&pos,(char)auStack_78);
      other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&pos);
      kj::_::NullableValue<unsigned_long>::NullableValue
                ((NullableValue<unsigned_long> *)local_d0,other);
      Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&pos);
      puVar10 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_d0);
      if (puVar10 == (unsigned_long *)0x0) {
        SVar24 = StringPtr::slice((StringPtr *)auStack_78,2);
        iter._M_node = (_Base_ptr)SVar24.content.ptr;
        AVar23 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&iter);
      }
      else {
        local_e8 = kj::_::NullableValue<unsigned_long>::operator*
                             ((NullableValue<unsigned_long> *)local_d0);
        AVar23 = StringPtr::slice((StringPtr *)auStack_78,2,*local_e8);
        name.ptr = (char *)AVar23.size_;
        maybeArg.ptr.field_1.value.content.size_ = (size_t)AVar23.ptr;
        local_f8 = AVar23;
        AVar23 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)auStack_78,*local_e8 + 1);
        local_108 = AVar23;
        Maybe<kj::StringPtr>::operator=
                  ((Maybe<kj::StringPtr> *)&_pos414.field_1,(StringPtr *)&local_108);
        AVar23.size_ = (size_t)name.ptr;
        AVar23.ptr = (char *)maybeArg.ptr.field_1.value.content.size_;
      }
      name.ptr = (char *)AVar23.size_;
      maybeArg.ptr.field_1.value.content.size_ = (size_t)AVar23.ptr;
      kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_d0);
      pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
      local_130._M_node =
           (_Base_ptr)
           std::
           map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_std::less<kj::ArrayPtr<const_char>_>,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
           ::find(&pIVar17->longOptions,(key_type *)&maybeArg.ptr.field_1.value.content.size_);
      pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
      local_138._M_node =
           (_Base_ptr)
           std::
           map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_std::less<kj::ArrayPtr<const_char>_>,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
           ::end(&pIVar17->longOptions);
      bVar5 = std::operator==(&local_130,&local_138);
      if (bVar5) {
        StringPtr::StringPtr(&local_148,"--help");
        bVar5 = StringPtr::operator==((StringPtr *)auStack_78,&local_148);
        if (bVar5) {
          local_158 = params_local.size_;
          programName_19.content.size_ = sVar18;
          programName_19.content.ptr = (char *)params_local.size_;
          sStack_150 = sVar18;
          printHelp(this,programName_19);
        }
        local_168 = (char *)params_local.size_;
        sStack_160 = sVar18;
        str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                  ((String *)&option,(kj *)"--",(char (*) [3])((long)&maybeArg.ptr.field_1 + 8),
                   (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pSVar22);
        StringPtr::StringPtr((StringPtr *)&local_178,(String *)&option);
        programName_18.content.size_ = sStack_160;
        programName_18.content.ptr = local_168;
        usageError(this,programName_18,(StringPtr)local_178);
      }
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>
                ::operator->(&local_130);
      pOVar1 = ppVar11->second;
      if ((pOVar1->hasArg & 1U) == 0) {
        bVar5 = Maybe<kj::StringPtr>::operator==((Maybe<kj::StringPtr> *)&_pos414.field_1);
        if (!bVar5) {
          local_438 = (char *)params_local.size_;
          sStack_430 = sVar18;
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                    (&local_460,(kj *)"--",(char (*) [3])((long)&maybeArg.ptr.field_1 + 8),
                     (ArrayPtr<const_char> *)": option does not accept an argument",
                     (char (*) [37])pSVar22);
          StringPtr::StringPtr((StringPtr *)&local_448,&local_460);
          programName_13.content.size_ = sStack_430;
          programName_13.content.ptr = local_438;
          usageError(this,programName_13,(StringPtr)local_448);
        }
        Function<kj::MainBuilder::Validity_()>::operator()
                  ((Validity *)&error_2,(pOVar1->field_2).func);
        Validity::releaseError(&local_3b8,(Validity *)&error_2);
        pNVar14 = kj::_::readMaybe<kj::String>(&local_3b8);
        kj::_::NullableValue<kj::String>::NullableValue
                  ((NullableValue<kj::String> *)local_398,pNVar14);
        Maybe<kj::String>::~Maybe(&local_3b8);
        Validity::~Validity((Validity *)&error_2);
        pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_398);
        if (pSVar15 != (String *)0x0) {
          local_3e0 = kj::_::NullableValue<kj::String>::operator*
                                ((NullableValue<kj::String> *)local_398);
          local_3f8 = (char *)params_local.size_;
          sStack_3f0 = sVar18;
          str<kj::StringPtr&,char_const(&)[3],kj::String&>
                    (&local_420,(kj *)auStack_78,(StringPtr *)0x2eef9c,(char (*) [3])local_3e0,
                     pSVar22);
          StringPtr::StringPtr((StringPtr *)&local_408,&local_420);
          programName_14.content.size_ = sStack_3f0;
          programName_14.content.ptr = local_3f8;
          usageError(this,programName_14,(StringPtr)local_408);
        }
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_398);
      }
      else {
        pAVar16 = &kj::_::readMaybe<kj::StringPtr>((Maybe<kj::StringPtr> *)&_pos414.field_1)->
                   content;
        if (pAVar16 == (ArrayPtr<const_char> *)0x0) {
          sVar8 = ArrayPtr<const_kj::StringPtr>::size((ArrayPtr<const_kj::StringPtr> *)&this_local);
          bVar5 = false;
          if (local_58 + 1 < sVar8) {
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
            StringPtr::StringPtr((StringPtr *)&_error440.field_1.value.content.disposer,"-");
            bVar6 = StringPtr::startsWith
                              (pSVar9,(StringPtr *)&_error440.field_1.value.content.disposer);
            bVar5 = false;
            if (bVar6) {
              pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                 ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
              sVar8 = StringPtr::size(pSVar9);
              bVar5 = 1 < sVar8;
            }
            bVar5 = (bool)(bVar5 ^ 1);
          }
          if (!bVar5) {
            local_348 = (char *)params_local.size_;
            sStack_340 = sVar18;
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                      (&local_370,(kj *)"--",(char (*) [3])((long)&maybeArg.ptr.field_1 + 8),
                       (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pSVar22);
            StringPtr::StringPtr((StringPtr *)&local_358,&local_370);
            programName_15.content.size_ = sStack_340;
            programName_15.content.ptr = local_348;
            usageError(this,programName_15,(StringPtr)local_358);
          }
          local_58 = local_58 + 1;
          pFVar2 = (pOVar1->field_2).funcWithArg;
          pAVar16 = &ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58)->content;
          error_1 = (String *)pAVar16->ptr;
          sStack_2e0 = pAVar16->size_;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_2d0,pFVar2,(StringPtr)*pAVar16);
          Validity::releaseError(&local_2b0,&local_2d0);
          pNVar14 = kj::_::readMaybe<kj::String>(&local_2b0);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_290,pNVar14);
          Maybe<kj::String>::~Maybe(&local_2b0);
          Validity::~Validity(&local_2d0);
          pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_290);
          if (pSVar15 != (String *)0x0) {
            local_2f0 = kj::_::NullableValue<kj::String>::operator*
                                  ((NullableValue<kj::String> *)local_290);
            local_308 = (char *)params_local.size_;
            sStack_300 = sVar18;
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58);
            str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                      (&local_330,(kj *)auStack_78,(StringPtr *)"=",(char (*) [2])pSVar9,
                       (StringPtr *)0x2eef9c,(char (*) [3])local_2f0,in_stack_ffffffffffffef18);
            StringPtr::StringPtr((StringPtr *)&local_318,&local_330);
            programName_16.content.size_ = sStack_300;
            programName_16.content.ptr = local_308;
            usageError(this,programName_16,(StringPtr)local_318);
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_290);
        }
        else {
          error = (String *)pAVar16->ptr;
          sStack_210 = pAVar16->size_;
          _error433.field_1.value.content.disposer = (ArrayDisposer *)pAVar16;
          Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                    (&local_208,(pOVar1->field_2).funcWithArg,(StringPtr)*pAVar16);
          Validity::releaseError(&local_1e8,&local_208);
          pNVar14 = kj::_::readMaybe<kj::String>(&local_1e8);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_1c8,pNVar14);
          Maybe<kj::String>::~Maybe(&local_1e8);
          Validity::~Validity(&local_208);
          pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_1c8);
          if (pSVar15 != (String *)0x0) {
            local_220 = kj::_::NullableValue<kj::String>::operator*
                                  ((NullableValue<kj::String> *)local_1c8);
            local_238 = (char *)params_local.size_;
            sStack_230 = sVar18;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      (&local_260,(kj *)auStack_78,(StringPtr *)0x2eef9c,(char (*) [3])local_220,
                       pSVar22);
            StringPtr::StringPtr((StringPtr *)&local_248,&local_260);
            programName_17.content.size_ = sStack_230;
            programName_17.content.ptr = local_238;
            usageError(this,programName_17,(StringPtr)local_248);
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_1c8);
        }
      }
      Maybe<kj::StringPtr>::~Maybe((Maybe<kj::StringPtr> *)&_pos414.field_1);
    }
    else {
      StringPtr::StringPtr((StringPtr *)local_470,"-");
      bVar6 = StringPtr::startsWith((StringPtr *)auStack_78,(StringPtr *)local_470);
      pacVar19 = (char (*) [18])CONCAT71((int7)(sVar8 >> 8),bVar6);
      bVar5 = false;
      if (bVar6) {
        sVar8 = StringPtr::size((StringPtr *)auStack_78);
        bVar5 = 1 < sVar8;
      }
      if (bVar5) {
        iter_1._M_node._4_4_ = 1;
        while( true ) {
          uVar12 = (ulong)iter_1._M_node._4_4_;
          sVar8 = StringPtr::size((StringPtr *)auStack_78);
          if (sVar8 <= uVar12) break;
          iter_1._M_node._3_1_ =
               StringPtr::operator[]((StringPtr *)auStack_78,(ulong)iter_1._M_node._4_4_);
          pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
          local_480._M_node =
               (_Base_ptr)
               std::
               map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
               ::find(&pIVar17->shortOptions,(key_type_conflict1 *)((long)&iter_1._M_node + 3));
          pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
          local_488._M_node =
               (_Base_ptr)
               std::
               map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
               ::end(&pIVar17->shortOptions);
          bVar5 = std::operator==(&local_480,&local_488);
          if (bVar5) {
            local_498 = (char *)params_local.size_;
            sStack_490 = sVar18;
            str<char_const(&)[2],char&,char_const(&)[22]>
                      ((String *)&option_1,(kj *)0x2f0e59,(char (*) [2])((long)&iter_1._M_node + 3),
                       ": unrecognized option",(char (*) [22])pSVar22);
            StringPtr::StringPtr((StringPtr *)&local_4a8,(String *)&option_1);
            programName_12.content.size_ = sStack_490;
            programName_12.content.ptr = local_498;
            usageError(this,programName_12,(StringPtr)local_4a8);
          }
          ppVar13 = std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>
                    ::operator->(&local_480);
          pOVar1 = ppVar13->second;
          if ((pOVar1->hasArg & 1U) != 0) {
            uVar7 = iter_1._M_node._4_4_ + 1;
            sVar8 = StringPtr::size((StringPtr *)auStack_78);
            if (uVar7 < sVar8) {
              SVar24 = StringPtr::slice((StringPtr *)auStack_78,(ulong)(iter_1._M_node._4_4_ + 1));
              sStack_540 = SVar24.content.size_;
              error_3 = (String *)SVar24.content.ptr;
              _error471.field_1.value.content.disposer = (ArrayDisposer *)error_3;
              Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                        (&local_538,(pOVar1->field_2).funcWithArg,SVar24);
              Validity::releaseError(&local_518,&local_538);
              pNVar14 = kj::_::readMaybe<kj::String>(&local_518);
              kj::_::NullableValue<kj::String>::NullableValue
                        ((NullableValue<kj::String> *)local_4f8,pNVar14);
              Maybe<kj::String>::~Maybe(&local_518);
              Validity::~Validity(&local_538);
              pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_4f8);
              if (pSVar15 != (String *)0x0) {
                local_550 = kj::_::NullableValue<kj::String>::operator*
                                      ((NullableValue<kj::String> *)local_4f8);
                local_568 = (char *)params_local.size_;
                sStack_560 = sVar18;
                str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                          (&local_590,(kj *)0x2f0e59,(char (*) [2])((long)&iter_1._M_node + 3)," ",
                           (char (*) [2])((long)&_error471.field_1 + 0x10),(StringPtr *)0x2eef9c,
                           (char (*) [3])local_550,in_stack_ffffffffffffef20);
                StringPtr::StringPtr((StringPtr *)&local_578,&local_590);
                programName_11.content.size_ = sStack_560;
                programName_11.content.ptr = local_568;
                usageError(this,programName_11,(StringPtr)local_578);
              }
              kj::_::NullableValue<kj::String>::~NullableValue
                        ((NullableValue<kj::String> *)local_4f8);
            }
            else {
              sVar8 = ArrayPtr<const_kj::StringPtr>::size
                                ((ArrayPtr<const_kj::StringPtr> *)&this_local);
              bVar5 = false;
              if (local_58 + 1 < sVar8) {
                pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                   ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
                StringPtr::StringPtr((StringPtr *)&_error479.field_1.value.content.disposer,"-");
                bVar6 = StringPtr::startsWith
                                  (pSVar9,(StringPtr *)&_error479.field_1.value.content.disposer);
                bVar5 = false;
                if (bVar6) {
                  pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                     ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
                  sVar8 = StringPtr::size(pSVar9);
                  bVar5 = 1 < sVar8;
                }
                bVar5 = (bool)(bVar5 ^ 1);
              }
              if (!bVar5) {
                local_678 = (char *)params_local.size_;
                sStack_670 = sVar18;
                str<char_const(&)[2],char&,char_const(&)[19]>
                          ((String *)&_error488.field_1.value.content.disposer,(kj *)0x2f0e59,
                           (char (*) [2])((long)&iter_1._M_node + 3),": missing argument",
                           (char (*) [19])pSVar22);
                StringPtr::StringPtr
                          ((StringPtr *)&local_688,
                           (String *)&_error488.field_1.value.content.disposer);
                programName_09.content.size_ = sStack_670;
                programName_09.content.ptr = local_678;
                usageError(this,programName_09,(StringPtr)local_688);
              }
              local_58 = local_58 + 1;
              pFVar2 = (pOVar1->field_2).funcWithArg;
              pAVar16 = &ArrayPtr<const_kj::StringPtr>::operator[]
                                   ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58)->content;
              error_4 = (String *)pAVar16->ptr;
              sStack_610 = pAVar16->size_;
              Function<kj::MainBuilder::Validity_(kj::StringPtr)>::operator()
                        (&local_600,pFVar2,(StringPtr)*pAVar16);
              Validity::releaseError(&local_5e0,&local_600);
              pNVar14 = kj::_::readMaybe<kj::String>(&local_5e0);
              kj::_::NullableValue<kj::String>::NullableValue
                        ((NullableValue<kj::String> *)local_5c0,pNVar14);
              Maybe<kj::String>::~Maybe(&local_5e0);
              Validity::~Validity(&local_600);
              pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_5c0);
              if (pSVar15 != (String *)0x0) {
                local_620 = kj::_::NullableValue<kj::String>::operator*
                                      ((NullableValue<kj::String> *)local_5c0);
                local_638 = (char *)params_local.size_;
                sStack_630 = sVar18;
                pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                   ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58);
                str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                          (&local_660,(kj *)0x2f0e59,(char (*) [2])((long)&iter_1._M_node + 3)," ",
                           (char (*) [2])pSVar9,(StringPtr *)0x2eef9c,(char (*) [3])local_620,
                           in_stack_ffffffffffffef20);
                StringPtr::StringPtr((StringPtr *)&local_648,&local_660);
                programName_10.content.size_ = sStack_630;
                programName_10.content.ptr = local_638;
                usageError(this,programName_10,(StringPtr)local_648);
              }
              kj::_::NullableValue<kj::String>::~NullableValue
                        ((NullableValue<kj::String> *)local_5c0);
            }
            break;
          }
          Function<kj::MainBuilder::Validity_()>::operator()
                    ((Validity *)&error_5,(pOVar1->field_2).func);
          Validity::releaseError(&local_6e0,(Validity *)&error_5);
          pNVar14 = kj::_::readMaybe<kj::String>(&local_6e0);
          kj::_::NullableValue<kj::String>::NullableValue
                    ((NullableValue<kj::String> *)local_6c0,pNVar14);
          Maybe<kj::String>::~Maybe(&local_6e0);
          Validity::~Validity((Validity *)&error_5);
          pSVar15 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_6c0);
          if (pSVar15 != (String *)0x0) {
            local_708 = kj::_::NullableValue<kj::String>::operator*
                                  ((NullableValue<kj::String> *)local_6c0);
            local_718 = (char *)params_local.size_;
            sStack_710 = sVar18;
            str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                      ((String *)&iter_2,(kj *)0x2f0e59,(char (*) [2])((long)&iter_1._M_node + 3),
                       ": ",(char (*) [3])local_708,in_R9);
            StringPtr::StringPtr((StringPtr *)&local_728,(String *)&iter_2);
            programName_08.content.size_ = sStack_710;
            programName_08.content.ptr = local_718;
            usageError(this,programName_08,(StringPtr)local_728);
          }
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_6c0);
          iter_1._M_node._4_4_ = iter_1._M_node._4_4_ + 1;
        }
      }
      else {
        pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
        bVar5 = std::
                map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                ::empty(&pIVar17->subCommands);
        if (!bVar5) {
          pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
          local_748._M_node =
               (_Base_ptr)
               std::
               map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
               ::find(&pIVar17->subCommands,(key_type *)auStack_78);
          pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
          subMain.impl.ptr =
               (Iface *)std::
                        map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                        ::end(&pIVar17->subCommands);
          bVar5 = std::operator==(&local_748,(_Self *)&subMain.impl.ptr);
          if (((bVar5 ^ 0xffU) & 1) == 0) {
            StringPtr::StringPtr(&local_7b8,"help");
            bVar5 = StringPtr::operator==((StringPtr *)auStack_78,&local_7b8);
            if (!bVar5) {
              local_928 = (char *)params_local.size_;
              sStack_920 = sVar18;
              str<kj::StringPtr&,char_const(&)[18]>
                        (&local_950,(kj *)auStack_78,(StringPtr *)": unknown command",pacVar19);
              StringPtr::StringPtr((StringPtr *)&local_938,&local_950);
              programName_05.content.size_ = sStack_920;
              programName_05.content.ptr = local_928;
              usageError(this,programName_05,(StringPtr)local_938);
            }
            pacVar19 = (char (*) [18])
                       ArrayPtr<const_kj::StringPtr>::size
                                 ((ArrayPtr<const_kj::StringPtr> *)&this_local);
            if (pacVar19 <= (char (*) [18])(local_58 + 1)) {
              local_918 = params_local.size_;
              programName_06.content.size_ = sVar18;
              programName_06.content.ptr = (char *)params_local.size_;
              sStack_910 = sVar18;
              printHelp(this,programName_06);
            }
            pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
            local_748._M_node =
                 (_Base_ptr)
                 std::
                 map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                 ::find(&pIVar17->subCommands,pSVar9);
            pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
            subMain_1.impl.ptr =
                 (Iface *)std::
                          map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                          ::end(&pIVar17->subCommands);
            bVar5 = std::operator==(&local_748,(_Self *)&subMain_1.impl.ptr);
            if (((bVar5 ^ 0xffU) & 1) == 0) {
              pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                 ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
              StringPtr::StringPtr((StringPtr *)&j_1,"help");
              bVar5 = StringPtr::operator==(pSVar9,(StringPtr *)&j_1);
              if (bVar5) {
                local_84c = 0;
                local_850 = (int)local_58 + 2;
                while( true ) {
                  pacVar19 = (char (*) [18])(ulong)local_850;
                  pacVar20 = (char (*) [18])
                             ArrayPtr<const_kj::StringPtr>::size
                                       ((ArrayPtr<const_kj::StringPtr> *)&this_local);
                  local_f91 = false;
                  if (pacVar19 < pacVar20) {
                    pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                       ((ArrayPtr<const_kj::StringPtr> *)&this_local,
                                        (ulong)local_850);
                    StringPtr::StringPtr(&local_860,"help");
                    bVar5 = StringPtr::operator==(pSVar9,&local_860);
                    pacVar19 = (char (*) [18])CONCAT71((int7)((ulong)pacVar19 >> 8),bVar5);
                    local_fa2 = true;
                    if (!bVar5) {
                      pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                                         ((ArrayPtr<const_kj::StringPtr> *)&this_local,
                                          (ulong)local_850);
                      StringPtr::StringPtr(&local_870,"--help");
                      local_fa2 = StringPtr::operator==(pSVar9,&local_870);
                    }
                    local_f91 = local_fa2;
                  }
                  if (local_f91 == false) break;
                  local_84c = local_84c + 1;
                  local_850 = local_850 + 1;
                }
                if (local_84c == 0) {
                  pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
                  pPVar3 = pIVar17->context;
                  StringPtr::StringPtr(&local_880,"Help about help?  We must go deeper...");
                  (*pPVar3->_vptr_ProcessContext[5])
                            (pPVar3,local_880.content.ptr,local_880.content.size_);
LAB_002b57e4:
                  pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
                  pPVar3 = pIVar17->context;
                  StringPtr::StringPtr
                            (&local_890,
                             "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
                            );
                  (*pPVar3->_vptr_ProcessContext[5])
                            (pPVar3,local_890.content.ptr,local_890.content.size_);
LAB_002b583f:
                  pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
                  pPVar3 = pIVar17->context;
                  StringPtr::StringPtr(&local_8a0,"Help, I\'m trapped in a help text factory!");
                  (*pPVar3->_vptr_ProcessContext[5])
                            (pPVar3,local_8a0.content.ptr,local_8a0.content.size_);
                }
                else {
                  if (local_84c == 1) goto LAB_002b57e4;
                  if (local_84c == 2) goto LAB_002b583f;
                }
                if (local_84c < 10) {
                  pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
                  pPVar3 = pIVar17->context;
                  StringPtr::StringPtr(&local_8b0,"Killed by signal 911 (SIGHELP)");
                  (*pPVar3->_vptr_ProcessContext[4])
                            (pPVar3,local_8b0.content.ptr,local_8b0.content.size_);
                }
                pIVar17 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
                pPVar3 = pIVar17->context;
                StringPtr::StringPtr(&local_8c0,"How to keep an idiot busy...");
                (*pPVar3->_vptr_ProcessContext[5])
                          (pPVar3,local_8c0.content.ptr,local_8c0.content.size_);
              }
              local_8d8 = (char *)params_local.size_;
              sStack_8d0 = sVar18;
              this_00 = (kj *)ArrayPtr<const_kj::StringPtr>::operator[]
                                        ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
              str<kj::StringPtr_const&,char_const(&)[18]>
                        (&local_900,this_00,(StringPtr *)": unknown command",pacVar19);
              StringPtr::StringPtr((StringPtr *)&local_8e8,&local_900);
              programName_07.content.size_ = sStack_8d0;
              programName_07.content.ptr = local_8d8;
              usageError(this,programName_07,(StringPtr)local_8e8);
            }
            std::
            _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>::
            operator->(&local_748);
            Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
            operator()((Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                        *)&dummyArg.content.size_);
            StringPtr::StringPtr((StringPtr *)local_7e8,"--help");
            local_811[0] = 0x20;
            pSVar9 = ArrayPtr<const_kj::StringPtr>::operator[]
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1);
            str<kj::StringPtr&,char,kj::StringPtr_const&>
                      ((String *)(local_811 + 1),(kj *)&params_local.size_,(StringPtr *)local_811,
                       (char *)pSVar9,(StringPtr *)pSVar22);
            StringPtr::StringPtr((StringPtr *)&local_7f8,(String *)(local_811 + 1));
            local_838 = arrayPtr<kj::StringPtr>((StringPtr *)local_7e8,1);
            local_828 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_838);
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::operator()
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       &dummyArg.content.size_,(StringPtr)local_7f8,local_828);
            String::~String((String *)(local_811 + 1));
            local_7a4 = 1;
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::~Function
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       &dummyArg.content.size_);
          }
          else {
            std::
            _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>::
            operator->(&local_748);
            Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
            operator()((Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                        *)local_760);
            local_789[0] = 0x20;
            str<kj::StringPtr&,char,kj::StringPtr&>
                      ((String *)(local_789 + 1),(kj *)&params_local.size_,(StringPtr *)local_789,
                       auStack_78,(StringPtr *)pSVar22);
            StringPtr::StringPtr((StringPtr *)&local_770,(String *)(local_789 + 1));
            sVar18 = ArrayPtr<const_kj::StringPtr>::size
                               ((ArrayPtr<const_kj::StringPtr> *)&this_local);
            local_7a0 = ArrayPtr<const_kj::StringPtr>::slice
                                  ((ArrayPtr<const_kj::StringPtr> *)&this_local,local_58 + 1,sVar18)
            ;
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::operator()
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       local_760,(StringPtr)local_770,local_7a0);
            String::~String((String *)(local_789 + 1));
            local_7a4 = 1;
            Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::~Function
                      ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)
                       local_760);
          }
          goto LAB_002b646e;
        }
        Vector<kj::StringPtr>::add<kj::StringPtr&>
                  ((Vector<kj::StringPtr> *)&i,(StringPtr *)auStack_78);
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_SOME(pos, param.findFirst('=')) {
        name = param.slice(2, pos);
        maybeArg = param.slice(pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_SOME(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_SOME(error, (*option.funcWithArg)(arg).releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_SOME(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == kj::none) {
            KJ_IF_SOME(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }